

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::find_even_first_predicate(void)

{
  array<int,_4UL> storage;
  undefined4 local_54;
  int *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 *local_38;
  
  local_48 = 0x2c;
  uStack_44 = 0x21;
  uStack_40 = 0x16;
  uStack_3c = 0xb;
  local_54 = 0x2d;
  local_50 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_48,&local_38,&local_54);
  local_38 = &local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 45, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3dd,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  local_54 = 0x2c;
  local_50 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_48,&local_38,&local_54);
  local_38 = &local_48;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 44, std::greater<int>{})",
             "storage.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3df,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  local_54 = 0x2b;
  local_50 = vista::lower_bound_sorted<int*,int,std::greater<int>>(&local_48,&local_38,&local_54);
  local_38 = &uStack_44;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 43, std::greater<int>{})",
             "std::next(storage.begin(), 1)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3e1,"void lower_bound_sorted_suite::find_even_first_predicate()",&local_50,&local_38
            );
  return;
}

Assistant:

void find_even_first_predicate()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 45, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 44, std::greater<int>{}),
                  storage.begin());
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 43, std::greater<int>{}),
                  std::next(storage.begin(), 1));
}